

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O3

float query_decision(active *a,float ec_revert_weight,float k)

{
  double dVar1;
  shared_data *psVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  
  fVar5 = 1.0;
  if (1.0 < k) {
    psVar2 = a->all->sd;
    dVar4 = psVar2->weighted_labeled_examples;
    dVar1 = psVar2->sum_loss;
    fVar5 = logf(k);
    dVar4 = ((double)fVar5 * 0.5 + 1.0) / ((double)(float)dVar4 + 0.0001);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    fVar5 = get_active_coin_bias
                      (k,(float)(dVar1 / (double)k + dVar4),ec_revert_weight / k,a->active_c0);
  }
  fVar3 = merand48(&a->all->random_state);
  return (float)(~-(uint)(fVar3 < fVar5) & 0xbf800000 | (uint)(1.0 / fVar5) & -(uint)(fVar3 < fVar5)
                );
}

Assistant:

float query_decision(active& a, float ec_revert_weight, float k)
{
  float bias, avg_loss, weighted_queries;
  if (k <= 1.)
    bias = 1.;
  else
  {
    weighted_queries = (float)a.all->sd->weighted_labeled_examples;
    avg_loss = (float)(a.all->sd->sum_loss / k + sqrt((1. + 0.5 * log(k)) / (weighted_queries + 0.0001)));
    bias = get_active_coin_bias(k, avg_loss, ec_revert_weight / k, a.active_c0);
  }
  if (merand48(a.all->random_state) < bias)
    return 1.f / bias;
  else
    return -1.;
}